

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::Sudoku(Sudoku *this,int size,SudokuType type)

{
  int iVar1;
  Field *this_00;
  reference this_01;
  iterator iVar2;
  unique_ptr<Field,_std::default_delete<Field>_> local_40;
  uint local_34;
  uint local_30;
  int y;
  int x;
  allocator local_19;
  SudokuType local_18;
  int local_14;
  SudokuType type_local;
  int size_local;
  Sudoku *this_local;
  
  this->_vptr_Sudoku = (_func_int **)&PTR_print_00170958;
  local_18 = type;
  local_14 = size;
  _type_local = this;
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::vector
            (&this->fields_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
  ::__normal_iterator(&this->field_begin_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
  ::__normal_iterator(&this->field_end_);
  std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::list
            (&this->furtherWays_);
  this->type_ = local_18;
  this->size_ = local_14;
  this->squared_size_ = local_14 * local_14;
  this->current_z_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->filename_,"out.txt",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::__cxx11::string::string((string *)&this->solutionHints_);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&this->nPossibilities_);
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::resize
            (&this->fields_,(ulong)(uint)(this->squared_size_ * this->squared_size_));
  for (local_30 = 0; (int)local_30 < this->squared_size_; local_30 = local_30 + 1) {
    for (local_34 = 0; (int)local_34 < this->squared_size_; local_34 = local_34 + 1) {
      this_00 = (Field *)operator_new(0xd8);
      iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)local_30,(ulong)local_34);
      Field::Field(this_00,iVar1,local_30,local_34,this->current_z_,this->squared_size_);
      std::unique_ptr<Field,std::default_delete<Field>>::unique_ptr<std::default_delete<Field>,void>
                ((unique_ptr<Field,std::default_delete<Field>> *)&local_40,this_00);
      iVar1 = (*this->_vptr_Sudoku[7])(this,(ulong)local_30,(ulong)local_34);
      this_01 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                operator[](&this->fields_,(long)iVar1);
      std::shared_ptr<Field>::operator=(this_01,&local_40);
      std::unique_ptr<Field,_std::default_delete<Field>_>::~unique_ptr(&local_40);
    }
  }
  iVar2 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::begin
                    (&this->fields_);
  (this->field_begin_)._M_current = iVar2._M_current;
  iVar2 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::end
                    (&this->fields_);
  (this->field_end_)._M_current = iVar2._M_current;
  (*this->_vptr_Sudoku[8])();
  return;
}

Assistant:

Sudoku::Sudoku(int size, SudokuType type) : type_(type), size_(size), squared_size_(size*size), current_z_(0), filename_("out.txt")
{
  fields_.resize(squared_size_*squared_size_);

  //srand(std::time(NULL));

  //create fields
  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      fields_[index(x,y)] = std::move(std::unique_ptr<Field>(new Field(index(x,y),x,y,current_z_,squared_size_)));
    }
  }
  /*
  unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
  std::shuffle(fields_.begin(), fields_.end(), std::default_random_engine(seed));
  */

  field_begin_= fields_.begin();
  field_end_ = fields_.end();
  addDependencies();
}